

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

bool tinyusdz::value::IsLerpSupportedType(uint32_t tyid)

{
  bool bVar1;
  ulong uVar2;
  uint32_t in_EDX;
  byte bVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  string local_68;
  undefined1 local_48 [8];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  TryGetUnderlyingTypeName_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,(value *)(ulong)tyid,in_EDX);
  bVar1 = local_48[0];
  if (local_48[0] == true) {
    if (local_40.data.__align == (anon_struct_8_0_00000001_for___align)((long)&local_40 + 0x10)) {
      local_68.field_2._8_8_ = local_40._24_8_;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)local_40.data._0_8_;
    }
    local_68.field_2._M_allocated_capacity = local_40._16_8_;
    local_68._M_string_length = local_40._8_8_;
    TryGetTypeId((optional<unsigned_int> *)local_48,&local_68);
    if (local_48[0] == false) goto LAB_002a80db;
  }
  else {
LAB_002a80db:
    local_48._4_4_ = (storage_t<unsigned_int>)0x0;
  }
  if ((bVar1 == true) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar3 = 1;
  if (tyid == 0xe) goto LAB_002a8103;
  if ((tyid >> 0x14 & 1) != 0) {
    if (tyid - 0x10000e < 0x2b) {
      bVar3 = (byte)(0x71ffc000039 >> ((byte)(tyid - 0x10000e) & 0x3f));
      if (((~bVar1 | bVar3) & 1) != 0) goto LAB_002a8103;
      goto LAB_002a81ac;
    }
    if (bVar1 != false) goto LAB_002a81ac;
    goto LAB_002a81ed;
  }
  if ((((tyid & 0xffeffffe) == 0x28) ||
      (((tyid - 0x11 < 0x1d && ((0x1e000007U >> (tyid - 0x11 & 0x1f) & 1) != 0)) ||
       (tyid == 0x30 || (tyid & 0xffeffffe) == 0x2e)))) ||
     (((tyid < 0x37 && ((0x46000000000000U >> ((ulong)tyid & 0x3f) & 1) != 0)) ||
      (bVar3 = tyid - 0x37 < 2, bVar1 != true || (bool)bVar3)))) goto LAB_002a8103;
LAB_002a81ac:
  bVar3 = 1;
  if ((storage_t<unsigned_int>)local_48._4_4_ == (storage_t<unsigned_int>)0xe) goto LAB_002a8103;
  if (((uint)local_48._4_4_ >> 0x14 & 1) == 0) {
    if (0x38 < (uint)local_48._4_4_) {
LAB_002a81ed:
      bVar3 = 0;
      goto LAB_002a8103;
    }
    uVar2 = 0x1c7ff00000e0000;
  }
  else {
    local_48._4_4_ = local_48._4_4_ - 0x10000e;
    if (0x2a < (uint)local_48._4_4_) goto LAB_002a81ed;
    uVar2 = 0x71ffc000039;
  }
  bVar3 = (byte)(uVar2 >> ((byte)local_48._4_4_ & 0x3f));
LAB_002a8103:
  return (bool)(bVar3 & 1);
}

Assistant:

bool IsLerpSupportedType(uint32_t tyid) {

  // TODO: Directly get underlying_typeid
  bool has_underlying_tyid{false};
  uint32_t underlying_tyid{TYPE_ID_INVALID};

  if (auto pv = TryGetUnderlyingTypeName(tyid)) {
    underlying_tyid = GetTypeId(pv.value());
    has_underlying_tyid = true;
  } 

  // See also for underlying_type_id to simplify check for Role types(e.g. color3f)
#define IS_SUPPORTED_TYPE(__tyid, __ty) \
  if (__tyid == value::TypeTraits<__ty>::type_id()) { \
    return true; \
  } else if (__tyid == value::TypeTraits<__ty>::underlying_type_id()) { \
    return true; \
  } else if (__tyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::type_id())) { \
      return true; \
    } else if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::underlying_type_id())) { \
      return true; \
    } \
  }

  // Assume __uty is underlying_type.
#define IS_SUPPORTED_UNDERLYING_TYPE(__utyid, __uty) \
  if (__utyid == value::TypeTraits<__uty>::type_id()) { \
    return true; \
  } else if (__utyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__utyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__uty>::type_id())) { \
      return true; \
    } \
  }

  IS_SUPPORTED_TYPE(tyid, value::half)
  IS_SUPPORTED_TYPE(tyid, value::half2)
  IS_SUPPORTED_TYPE(tyid, value::half3)
  IS_SUPPORTED_TYPE(tyid, value::half4)
  IS_SUPPORTED_TYPE(tyid, float)
  IS_SUPPORTED_TYPE(tyid, value::float2)
  IS_SUPPORTED_TYPE(tyid, value::float3)
  IS_SUPPORTED_TYPE(tyid, value::float4)
  IS_SUPPORTED_TYPE(tyid, double)
  IS_SUPPORTED_TYPE(tyid, value::double2)
  IS_SUPPORTED_TYPE(tyid, value::double3)
  IS_SUPPORTED_TYPE(tyid, value::double4)
  IS_SUPPORTED_TYPE(tyid, value::quath)
  IS_SUPPORTED_TYPE(tyid, value::quatf)
  IS_SUPPORTED_TYPE(tyid, value::quatd)
  IS_SUPPORTED_TYPE(tyid, value::matrix2d)
  IS_SUPPORTED_TYPE(tyid, value::matrix3d)
  IS_SUPPORTED_TYPE(tyid, value::matrix4d)

  if (has_underlying_tyid) {
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, float)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, double)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quath)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatf)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatd)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix2d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix3d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix4d)
  }

#undef IS_SUPPORTED_TYPE
#undef IS_SUPPORTED_UNDERLYING_TYPE

  return false;

}